

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O3

void Abc_NodeSortCubes(Abc_Obj_t *pNode,Vec_Ptr_t *vCubes,Vec_Str_t *vStore,int fWeight)

{
  char *pcVar1;
  uint uVar2;
  char *__dest;
  void *__src;
  int iVar3;
  void **ppvVar4;
  char *pcVar5;
  int iVar6;
  code *__compar;
  long lVar7;
  long lVar8;
  size_t __size;
  
  __dest = (char *)(pNode->field_5).pData;
  iVar3 = (pNode->vFanins).nSize;
  lVar8 = (long)iVar3;
  vCubes->nSize = 0;
  if (*__dest != '\0') {
    iVar3 = iVar3 + 3;
    pcVar5 = __dest;
    do {
      if (pcVar5[lVar8] != ' ') {
        __assert_fail("pCube[nVars] == \' \'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanOrder.c"
                      ,0x1da,"void Abc_NodeSortCubes(Abc_Obj_t *, Vec_Ptr_t *, Vec_Str_t *, int)");
      }
      pcVar5[lVar8] = '\0';
      uVar2 = vCubes->nSize;
      if (uVar2 == vCubes->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vCubes->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(vCubes->pArray,0x80);
          }
          vCubes->pArray = ppvVar4;
          vCubes->nCap = 0x10;
        }
        else {
          if (vCubes->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(vCubes->pArray,(ulong)uVar2 << 4);
          }
          vCubes->pArray = ppvVar4;
          vCubes->nCap = uVar2 * 2;
        }
      }
      else {
        ppvVar4 = vCubes->pArray;
      }
      iVar6 = vCubes->nSize;
      vCubes->nSize = iVar6 + 1U;
      ppvVar4[iVar6] = pcVar5;
      pcVar1 = pcVar5 + iVar3;
      pcVar5 = pcVar5 + iVar3;
    } while (*pcVar1 != '\0');
    if (0 < iVar6) {
      __compar = Abc_NodeCompareCubes2;
      if (fWeight == 0) {
        __compar = Abc_NodeCompareCubes1;
      }
      qsort(vCubes->pArray,(ulong)(iVar6 + 1U),8,__compar);
    }
  }
  iVar3 = vCubes->nSize;
  __size = (long)iVar3 * (lVar8 + 3);
  pcVar5 = vStore->pArray;
  if (vStore->nCap < (int)__size) {
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)malloc(__size);
    }
    else {
      pcVar5 = (char *)realloc(pcVar5,__size);
      iVar3 = vCubes->nSize;
    }
    vStore->pArray = pcVar5;
    vStore->nCap = (int)__size;
  }
  iVar6 = (int)(lVar8 + 3);
  if (0 < iVar3) {
    lVar7 = 0;
    do {
      __src = vCubes->pArray[lVar7];
      if (*(char *)((long)__src + lVar8) != '\0') {
        __assert_fail("pCube[nVars] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanOrder.c"
                      ,0x1e6,"void Abc_NodeSortCubes(Abc_Obj_t *, Vec_Ptr_t *, Vec_Str_t *, int)");
      }
      *(undefined1 *)((long)__src + lVar8) = 0x20;
      memcpy(pcVar5,__src,(long)iVar6);
      pcVar5 = pcVar5 + iVar6;
      lVar7 = lVar7 + 1;
      iVar3 = vCubes->nSize;
    } while (lVar7 < iVar3);
    pcVar5 = vStore->pArray;
  }
  memcpy(__dest,pcVar5,(long)(iVar3 * iVar6));
  return;
}

Assistant:

void Abc_NodeSortCubes( Abc_Obj_t * pNode, Vec_Ptr_t * vCubes, Vec_Str_t * vStore, int fWeight )
{
    char * pCube, * pPivot;
    char * pSop = (char *)pNode->pData;
    int i, nVars = Abc_ObjFaninNum(pNode);
    Vec_PtrClear( vCubes );
    Abc_SopForEachCube( pSop, nVars, pCube )
    {
        assert( pCube[nVars] == ' ' );
        pCube[nVars] = 0;
        Vec_PtrPush( vCubes, pCube );
    }
    if ( fWeight )
        Vec_PtrSort( vCubes, (int (*)())Abc_NodeCompareCubes2 );
    else
        Vec_PtrSort( vCubes, (int (*)())Abc_NodeCompareCubes1 );
    Vec_StrGrow( vStore, Vec_PtrSize(vCubes) * (nVars + 3) );
    pPivot = Vec_StrArray( vStore );
    Vec_PtrForEachEntry( char *, vCubes, pCube, i )
    {
        assert( pCube[nVars] == 0 );
        pCube[nVars] = ' ';
        memcpy( pPivot, pCube, (size_t)(nVars + 3) );
        pPivot += nVars + 3;
    }
    memcpy( pSop, Vec_StrArray(vStore), (size_t)(Vec_PtrSize(vCubes) * (nVars + 3)) );
}